

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesGeneric::Compute_inc_invMb_v
          (ChVariablesGeneric *this,ChVectorRef *result,ChVectorConstRef vect)

{
  long lVar1;
  add_assign_op<double,_double> local_11;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  local_10;
  
  lVar1 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  if (lVar1 != this->ndof) {
    __assert_fail("result.size() == ndof",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesGeneric.cpp"
                  ,0x31,
                  "virtual void chrono::ChVariablesGeneric::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  if ((vect->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value == lVar1) {
    if ((this->inv_Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
        .m_cols == lVar1) {
      local_10.m_lhs = &this->inv_Mmass;
      local_10.m_rhs = vect;
      Eigen::internal::
      call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>,0>,Eigen::internal::add_assign_op<double,double>>
                (result,&local_10,&local_11,(type)0x0);
      return;
    }
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Option = 0]"
                 );
  }
  __assert_fail("vect.size() == ndof",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesGeneric.cpp"
                ,0x32,
                "virtual void chrono::ChVariablesGeneric::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesGeneric::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == ndof);
    assert(vect.size() == ndof);
    result += inv_Mmass * vect;
}